

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamvbyte.c
# Opt level: O1

int svb_find_avx_d1_init
              (uint8_t *keyPtr,uint8_t *dataPtr,uint64_t count,uint32_t prev,uint32_t key,
              uint32_t *presult)

{
  uint uVar1;
  __m128i alVar2;
  undefined8 uVar3;
  int iVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  int iVar13;
  int iVar14;
  byte bVar16;
  undefined1 (*pauVar15) [16];
  uint uVar17;
  ulong uVar18;
  byte bVar19;
  uint uVar20;
  undefined1 (*pauVar21) [16];
  uint uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int unaff_R13D;
  bool bVar28;
  __m128i alVar29;
  __m128i key4;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  xmm_t PrevLow;
  xmm_t PrevHi;
  __m128i local_d8;
  uint32_t *local_c8;
  uint64_t local_c0;
  undefined1 local_b8 [136];
  
  local_c8 = presult;
  if (count < 0x20) {
    iVar14 = 0;
    goto LAB_0014179b;
  }
  local_c0 = count;
  local_b8._0_16_ = vpbroadcastd_avx512vl();
  uVar18 = *(ulong *)keyPtr;
  if (count >> 5 == 1) {
    iVar14 = 0;
  }
  else {
    auVar30 = vpbroadcastd_avx512vl();
    iVar14 = 0;
    uVar27 = 1;
    auVar31._8_4_ = 0x80000000;
    auVar31._0_8_ = 0x8000000080000000;
    auVar31._12_4_ = 0x80000000;
    uVar26 = uVar18;
    pauVar21 = (undefined1 (*) [16])dataPtr;
    do {
      uVar18 = *(ulong *)(keyPtr + uVar27 * 8);
      if (uVar26 == 0) {
        auVar32 = vlddqu_avx(*pauVar21);
        auVar32 = vpmovzxbw_avx(auVar32);
        auVar35 = vpslldq_avx(auVar32,2);
        auVar32 = vpaddd_avx(auVar35,auVar32);
        auVar35 = vpslldq_avx(auVar32,4);
        auVar32 = vpaddd_avx(auVar32,auVar35);
        auVar35 = vpmovzxwd_avx(auVar32);
        auVar36._4_4_ = local_b8._12_4_;
        auVar36._0_4_ = local_b8._12_4_;
        auVar36._8_4_ = local_b8._12_4_;
        auVar36._12_4_ = local_b8._12_4_;
        alVar29 = (__m128i)vpaddd_avx512vl(auVar35,auVar36);
        local_d8[0] = alVar29[0];
        local_d8[1] = alVar29[1];
        auVar32 = vpunpckhwd_avx(auVar32,(undefined1  [16])0x0);
        alVar2 = (__m128i)vpaddd_avx((undefined1  [16])alVar29,auVar32);
        local_b8._0_8_ = alVar2[0];
        local_b8._8_8_ = alVar2[1];
        if (alVar2[1]._4_4_ < key) {
          auVar32 = vlddqu_avx(*(undefined1 (*) [16])(*pauVar21 + 8));
          auVar32 = vpmovzxbw_avx(auVar32);
          auVar35 = vpslldq_avx(auVar32,2);
          auVar36 = vpshufd_avx((undefined1  [16])alVar2,0xff);
          auVar32 = vpaddd_avx(auVar35,auVar32);
          auVar35 = vpslldq_avx(auVar32,4);
          auVar32 = vpaddd_avx(auVar32,auVar35);
          auVar35 = vpmovzxwd_avx(auVar32);
          alVar2 = (__m128i)vpaddd_avx(auVar36,auVar35);
          local_d8[0] = alVar2[0];
          local_d8[1] = alVar2[1];
          auVar32 = vpunpckhwd_avx(auVar32,(undefined1  [16])0x0);
          alVar29 = (__m128i)vpaddd_avx((undefined1  [16])alVar2,auVar32);
          local_b8._0_8_ = alVar29[0];
          local_b8._8_8_ = alVar29[1];
          if (key <= alVar29[1]._4_4_) {
            uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar2 ^ auVar31);
            bVar19 = (byte)uVar3 & 0xf;
            bVar28 = (~bVar19 & 0xf) == 0;
            uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar29 ^ auVar31);
            bVar16 = (byte)uVar3 & 0xf;
            if (!bVar28) {
              bVar16 = bVar19;
            }
            pauVar15 = (undefined1 (*) [16])local_d8;
            if (bVar28) {
              pauVar15 = (undefined1 (*) [16])local_b8;
            }
            iVar13 = 0;
            for (uVar22 = (uint)(bVar16 ^ 0xf); (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000
                ) {
              iVar13 = iVar13 + 1;
            }
            auVar32 = vpshufb_avx(*pauVar15,
                                  *(undefined1 (*) [16])("" + (ulong)(bVar16 ^ 0xf) * 0x10));
            *presult = auVar32._0_4_;
            unaff_R13D = iVar13 + 8 + iVar14 + (uint)bVar28 * 4;
            goto LAB_00140ffa;
          }
          auVar32 = vlddqu_avx(pauVar21[1]);
          auVar32 = vpmovzxbw_avx(auVar32);
          auVar35 = vpslldq_avx(auVar32,2);
          auVar36 = vpshufd_avx((undefined1  [16])alVar29,0xff);
          auVar32 = vpaddd_avx(auVar35,auVar32);
          auVar35 = vpslldq_avx(auVar32,4);
          auVar32 = vpaddd_avx(auVar32,auVar35);
          auVar35 = vpmovzxwd_avx(auVar32);
          alVar2 = (__m128i)vpaddd_avx(auVar36,auVar35);
          local_d8[0] = alVar2[0];
          local_d8[1] = alVar2[1];
          auVar32 = vpunpckhwd_avx(auVar32,(undefined1  [16])0x0);
          alVar29 = (__m128i)vpaddd_avx((undefined1  [16])alVar2,auVar32);
          local_b8._0_8_ = alVar29[0];
          local_b8._8_8_ = alVar29[1];
          if (key <= alVar29[1]._4_4_) {
            uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar2 ^ auVar31);
            bVar19 = (byte)uVar3 & 0xf;
            bVar28 = (~bVar19 & 0xf) == 0;
            uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar29 ^ auVar31);
            bVar16 = (byte)uVar3 & 0xf;
            if (!bVar28) {
              bVar16 = bVar19;
            }
            pauVar15 = (undefined1 (*) [16])local_d8;
            if (bVar28) {
              pauVar15 = (undefined1 (*) [16])local_b8;
            }
            iVar13 = 0;
            for (uVar22 = (uint)(bVar16 ^ 0xf); (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000
                ) {
              iVar13 = iVar13 + 1;
            }
            auVar32 = vpshufb_avx(*pauVar15,
                                  *(undefined1 (*) [16])("" + (ulong)(bVar16 ^ 0xf) * 0x10));
            *presult = auVar32._0_4_;
            unaff_R13D = iVar13 + 0x10 + iVar14 + (uint)bVar28 * 4;
            goto LAB_00140ffa;
          }
          auVar32 = vlddqu_avx(*(undefined1 (*) [16])(pauVar21[1] + 8));
          auVar32 = vpmovzxbw_avx(auVar32);
          auVar35 = vpslldq_avx(auVar32,2);
          auVar36 = vpshufd_avx((undefined1  [16])alVar29,0xff);
          auVar32 = vpaddd_avx(auVar35,auVar32);
          auVar35 = vpslldq_avx(auVar32,4);
          auVar32 = vpaddd_avx(auVar32,auVar35);
          auVar35 = vpmovzxwd_avx(auVar32);
          alVar2 = (__m128i)vpaddd_avx(auVar36,auVar35);
          local_d8[0] = alVar2[0];
          local_d8[1] = alVar2[1];
          auVar32 = vpunpckhwd_avx(auVar32,(undefined1  [16])0x0);
          alVar29 = (__m128i)vpaddd_avx((undefined1  [16])alVar2,auVar32);
          local_b8._0_8_ = alVar29[0];
          local_b8._8_8_ = alVar29[1];
          if (key <= alVar29[1]._4_4_) {
            uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar2 ^ auVar31);
            bVar19 = (byte)uVar3 & 0xf;
            bVar28 = (~bVar19 & 0xf) == 0;
            uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar29 ^ auVar31);
            bVar16 = (byte)uVar3 & 0xf;
            if (!bVar28) {
              bVar16 = bVar19;
            }
            pauVar15 = (undefined1 (*) [16])local_d8;
            if (bVar28) {
              pauVar15 = (undefined1 (*) [16])local_b8;
            }
            iVar13 = 0;
            for (uVar22 = (uint)(bVar16 ^ 0xf); (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000
                ) {
              iVar13 = iVar13 + 1;
            }
            auVar32 = vpshufb_avx(*pauVar15,
                                  *(undefined1 (*) [16])("" + (ulong)(bVar16 ^ 0xf) * 0x10));
            *presult = auVar32._0_4_;
            unaff_R13D = iVar13 + 0x18 + iVar14 + (uint)bVar28 * 4;
            goto LAB_00140ffa;
          }
          iVar14 = iVar14 + 0x20;
          bVar28 = false;
          dataPtr = (uint8_t *)(pauVar21 + 2);
        }
        else {
          uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar29 ^ auVar31);
          bVar19 = (byte)uVar3 & 0xf;
          bVar28 = (~bVar19 & 0xf) == 0;
          uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar2 ^ auVar31);
          bVar16 = (byte)uVar3 & 0xf;
          if (!bVar28) {
            bVar16 = bVar19;
          }
          pauVar15 = (undefined1 (*) [16])local_d8;
          if (bVar28) {
            pauVar15 = (undefined1 (*) [16])local_b8;
          }
          iVar13 = 0;
          for (uVar22 = (uint)(bVar16 ^ 0xf); (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000)
          {
            iVar13 = iVar13 + 1;
          }
          auVar32 = vpshufb_avx(*pauVar15,*(undefined1 (*) [16])("" + (ulong)(bVar16 ^ 0xf) * 0x10))
          ;
          *presult = auVar32._0_4_;
          unaff_R13D = iVar14 + (uint)bVar28 * 4 + iVar13;
LAB_00140ffa:
          bVar28 = true;
          dataPtr = (uint8_t *)pauVar21;
        }
        bVar12 = false;
      }
      else {
        auVar32 = vpshufb_avx(*pauVar21,
                              *(undefined1 (*) [16])
                               (shuffleTable[0] + (uint)((int)(uVar26 & 0xff) << 4)));
        auVar35 = vpslldq_avx(auVar32,4);
        auVar32 = vpaddd_avx(auVar35,auVar32);
        auVar35._4_4_ = local_b8._12_4_;
        auVar35._0_4_ = local_b8._12_4_;
        auVar35._8_4_ = local_b8._12_4_;
        auVar35._12_4_ = local_b8._12_4_;
        auVar35 = vpaddd_avx512vl(auVar32,auVar35);
        auVar32 = vpslldq_avx(auVar32,8);
        alVar2 = (__m128i)vpaddd_avx(auVar35,auVar32);
        local_d8[0] = alVar2[0];
        local_d8[1] = alVar2[1];
        bVar16 = (byte)(uVar26 >> 8);
        dataPtr = *pauVar21 +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [bVar16] +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar26 & 0xff];
        auVar32 = vpshufb_avx(*(undefined1 (*) [16])
                               (*pauVar21 +
                               "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [uVar26 & 0xff]),(undefined1  [16])shuffleTable[bVar16]);
        auVar36 = vpslldq_avx(auVar32,4);
        auVar35 = vpshufd_avx((undefined1  [16])alVar2,0xff);
        auVar32 = vpaddd_avx(auVar36,auVar32);
        auVar36 = vpslldq_avx(auVar32,8);
        auVar32 = vpaddd_avx(auVar32,auVar36);
        alVar29 = (__m128i)vpaddd_avx(auVar32,auVar35);
        local_b8._0_8_ = alVar29[0];
        local_b8._8_8_ = alVar29[1];
        if (alVar29[1]._4_4_ < key) {
          uVar22 = (uint)uVar26 >> 0x10 & 0xff;
          auVar32 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                *(undefined1 (*) [16])(shuffleTable[0] + (uVar22 << 4)));
          auVar36 = vpslldq_avx(auVar32,4);
          auVar35 = vpshufd_avx((undefined1  [16])alVar29,0xff);
          auVar32 = vpaddd_avx(auVar36,auVar32);
          auVar36 = vpslldq_avx(auVar32,8);
          auVar32 = vpaddd_avx(auVar32,auVar36);
          alVar2 = (__m128i)vpaddd_avx(auVar32,auVar35);
          local_d8[0] = alVar2[0];
          local_d8[1] = alVar2[1];
          uVar24 = uVar26 >> 0x18 & 0xff;
          auVar32 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr +
                                 "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                 [uVar22]),
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar24 << 4)));
          dataPtr = *(undefined1 (*) [16])dataPtr +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar24] +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar22];
          auVar36 = vpslldq_avx(auVar32,4);
          auVar35 = vpshufd_avx((undefined1  [16])alVar2,0xff);
          auVar32 = vpaddd_avx(auVar36,auVar32);
          auVar36 = vpslldq_avx(auVar32,8);
          auVar32 = vpaddd_avx(auVar32,auVar36);
          alVar29 = (__m128i)vpaddd_avx(auVar32,auVar35);
          local_b8._0_8_ = alVar29[0];
          local_b8._8_8_ = alVar29[1];
          if (alVar29[1]._4_4_ < key) {
            uVar24 = uVar26 >> 0x20 & 0xff;
            auVar32 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar24 << 4))
                                 );
            auVar36 = vpslldq_avx(auVar32,4);
            auVar35 = vpshufd_avx((undefined1  [16])alVar29,0xff);
            auVar32 = vpaddd_avx(auVar36,auVar32);
            auVar36 = vpslldq_avx(auVar32,8);
            auVar32 = vpaddd_avx(auVar32,auVar36);
            alVar2 = (__m128i)vpaddd_avx(auVar32,auVar35);
            local_d8[0] = alVar2[0];
            local_d8[1] = alVar2[1];
            uVar25 = uVar26 >> 0x28 & 0xff;
            auVar32 = vpshufb_avx(*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])dataPtr +
                                   "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                   [uVar24]),
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar25 << 4))
                                 );
            dataPtr = *(undefined1 (*) [16])dataPtr +
                      (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar25] +
                      (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar24];
            auVar36 = vpslldq_avx(auVar32,4);
            auVar35 = vpshufd_avx((undefined1  [16])alVar2,0xff);
            auVar32 = vpaddd_avx(auVar36,auVar32);
            auVar36 = vpslldq_avx(auVar32,8);
            auVar32 = vpaddd_avx(auVar32,auVar36);
            alVar29 = (__m128i)vpaddd_avx(auVar32,auVar35);
            local_b8._0_8_ = alVar29[0];
            local_b8._8_8_ = alVar29[1];
            if (key <= alVar29[1]._4_4_) {
              uVar26 = vpcmpgtd_avx512vl(auVar30,auVar31 ^ (undefined1  [16])alVar2);
              if ((~(byte)(uVar26 & 0xf) & 0xf) == 0) {
                uVar3 = vpcmpgtd_avx512vl(auVar30,auVar31 ^ (undefined1  [16])alVar29);
                uVar22 = (uint)uVar3 & 0xf;
                iVar13 = 4;
                pauVar21 = (undefined1 (*) [16])local_b8;
              }
              else {
                uVar22 = (uint)(uVar26 & 0xf);
                iVar13 = 0;
                pauVar21 = (undefined1 (*) [16])local_d8;
              }
              iVar4 = 0;
              for (uVar17 = uVar22 ^ 0xf; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
                iVar4 = iVar4 + 1;
              }
              auVar32 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])("" + ((uVar22 ^ 0xf) << 4)));
              *presult = auVar32._0_4_;
              unaff_R13D = iVar13 + 0x10 + iVar4 + iVar14;
              goto LAB_00141049;
            }
            uVar24 = uVar26 >> 0x30 & 0xff;
            auVar32 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                  *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar24 << 4))
                                 );
            auVar36 = vpslldq_avx(auVar32,4);
            auVar35 = vpshufd_avx((undefined1  [16])alVar29,0xff);
            auVar32 = vpaddd_avx(auVar36,auVar32);
            auVar36 = vpslldq_avx(auVar32,8);
            auVar32 = vpaddd_avx(auVar32,auVar36);
            alVar2 = (__m128i)vpaddd_avx(auVar32,auVar35);
            local_d8[0] = alVar2[0];
            local_d8[1] = alVar2[1];
            auVar32 = vpshufb_avx(*(undefined1 (*) [16])
                                   (*(undefined1 (*) [16])dataPtr +
                                   "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                   [uVar24]),(undefined1  [16])shuffleTable[uVar26 >> 0x38]);
            dataPtr = *(undefined1 (*) [16])dataPtr +
                      (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar26 >> 0x38] +
                      (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar24];
            auVar36 = vpslldq_avx(auVar32,4);
            auVar35 = vpshufd_avx((undefined1  [16])alVar2,0xff);
            auVar32 = vpaddd_avx(auVar36,auVar32);
            auVar36 = vpslldq_avx(auVar32,8);
            auVar32 = vpaddd_avx(auVar32,auVar36);
            alVar29 = (__m128i)vpaddd_avx(auVar32,auVar35);
            local_b8._0_8_ = alVar29[0];
            local_b8._8_8_ = alVar29[1];
            if (key <= alVar29[1]._4_4_) {
              uVar26 = vpcmpgtd_avx512vl(auVar30,auVar31 ^ (undefined1  [16])alVar2);
              if ((~(byte)(uVar26 & 0xf) & 0xf) == 0) {
                uVar3 = vpcmpgtd_avx512vl(auVar30,auVar31 ^ (undefined1  [16])alVar29);
                uVar22 = (uint)uVar3 & 0xf;
                iVar13 = 4;
                pauVar21 = (undefined1 (*) [16])local_b8;
              }
              else {
                uVar22 = (uint)(uVar26 & 0xf);
                iVar13 = 0;
                pauVar21 = (undefined1 (*) [16])local_d8;
              }
              iVar4 = 0;
              for (uVar17 = uVar22 ^ 0xf; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
                iVar4 = iVar4 + 1;
              }
              auVar32 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])("" + ((uVar22 ^ 0xf) << 4)));
              *presult = auVar32._0_4_;
              unaff_R13D = iVar13 + 0x18 + iVar4 + iVar14;
              goto LAB_00141049;
            }
            iVar14 = iVar14 + 0x20;
            bVar28 = false;
            bVar12 = true;
            goto LAB_00141051;
          }
          uVar26 = vpcmpgtd_avx512vl(auVar30,auVar31 ^ (undefined1  [16])alVar2);
          if ((~(byte)(uVar26 & 0xf) & 0xf) == 0) {
            uVar3 = vpcmpgtd_avx512vl(auVar30,auVar31 ^ (undefined1  [16])alVar29);
            uVar22 = (uint)uVar3 & 0xf;
            iVar13 = 4;
            pauVar21 = (undefined1 (*) [16])local_b8;
          }
          else {
            uVar22 = (uint)(uVar26 & 0xf);
            iVar13 = 0;
            pauVar21 = (undefined1 (*) [16])local_d8;
          }
          iVar4 = 0;
          for (uVar17 = uVar22 ^ 0xf; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
            iVar4 = iVar4 + 1;
          }
          auVar32 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])("" + ((uVar22 ^ 0xf) << 4)));
          *presult = auVar32._0_4_;
          unaff_R13D = iVar13 + 8 + iVar4 + iVar14;
        }
        else {
          uVar26 = vpcmpgtd_avx512vl(auVar30,auVar31 ^ (undefined1  [16])alVar2);
          if ((~(byte)(uVar26 & 0xf) & 0xf) == 0) {
            uVar3 = vpcmpgtd_avx512vl(auVar30,auVar31 ^ (undefined1  [16])alVar29);
            uVar22 = (uint)uVar3 & 0xf;
            iVar13 = 4;
            pauVar21 = (undefined1 (*) [16])local_b8;
          }
          else {
            uVar22 = (uint)(uVar26 & 0xf);
            iVar13 = 0;
            pauVar21 = (undefined1 (*) [16])local_d8;
          }
          iVar4 = 0;
          for (uVar17 = uVar22 ^ 0xf; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
            iVar4 = iVar4 + 1;
          }
          auVar32 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])("" + ((uVar22 ^ 0xf) << 4)));
          *presult = auVar32._0_4_;
          unaff_R13D = iVar13 + iVar14 + iVar4;
        }
LAB_00141049:
        bVar28 = true;
        bVar12 = false;
      }
LAB_00141051:
      if (bVar28) goto LAB_00141790;
      uVar27 = uVar27 + 1;
      uVar26 = uVar18;
      pauVar21 = (undefined1 (*) [16])dataPtr;
    } while (count >> 5 != uVar27);
  }
  if (uVar18 == 0) {
    auVar30 = vlddqu_avx(*(undefined1 (*) [16])dataPtr);
    auVar30 = vpmovzxbw_avx(auVar30);
    auVar31 = vpslldq_avx(auVar30,2);
    auVar30 = vpaddd_avx(auVar31,auVar30);
    auVar31 = vpslldq_avx(auVar30,4);
    auVar30 = vpaddd_avx(auVar30,auVar31);
    auVar31 = vpmovzxwd_avx(auVar30);
    auVar32._4_4_ = local_b8._12_4_;
    auVar32._0_4_ = local_b8._12_4_;
    auVar32._8_4_ = local_b8._12_4_;
    auVar32._12_4_ = local_b8._12_4_;
    alVar29 = (__m128i)vpaddd_avx512vl(auVar31,auVar32);
    local_d8[0] = alVar29[0];
    local_d8[1] = alVar29[1];
    auVar30 = vpunpckhwd_avx(auVar30,(undefined1  [16])0x0);
    alVar2 = (__m128i)vpaddd_avx((undefined1  [16])alVar29,auVar30);
    local_b8._0_8_ = alVar2[0];
    local_b8._8_8_ = alVar2[1];
    if (alVar2[1]._4_4_ < key) {
      auVar30 = vlddqu_avx(*(undefined1 (*) [16])(*(undefined1 (*) [16])dataPtr + 8));
      auVar30 = vpmovzxbw_avx(auVar30);
      auVar31 = vpslldq_avx(auVar30,2);
      auVar32 = vpshufd_avx((undefined1  [16])alVar2,0xff);
      auVar30 = vpaddd_avx(auVar31,auVar30);
      auVar31 = vpslldq_avx(auVar30,4);
      auVar30 = vpaddd_avx(auVar30,auVar31);
      auVar31 = vpmovzxwd_avx(auVar30);
      alVar2 = (__m128i)vpaddd_avx(auVar32,auVar31);
      local_d8[0] = alVar2[0];
      local_d8[1] = alVar2[1];
      auVar30 = vpunpckhwd_avx(auVar30,(undefined1  [16])0x0);
      alVar29 = (__m128i)vpaddd_avx((undefined1  [16])alVar2,auVar30);
      local_b8._0_8_ = alVar29[0];
      local_b8._8_8_ = alVar29[1];
      if (alVar29[1]._4_4_ < key) {
        auVar30 = vlddqu_avx(*(undefined1 (*) [16])((long)dataPtr + 0x10));
        auVar30 = vpmovzxbw_avx(auVar30);
        auVar31 = vpslldq_avx(auVar30,2);
        auVar32 = vpshufd_avx((undefined1  [16])alVar29,0xff);
        auVar30 = vpaddd_avx(auVar31,auVar30);
        auVar31 = vpslldq_avx(auVar30,4);
        auVar30 = vpaddd_avx(auVar30,auVar31);
        auVar31 = vpmovzxwd_avx(auVar30);
        local_d8 = (__m128i)vpaddd_avx(auVar32,auVar31);
        auVar30 = vpunpckhwd_avx(auVar30,(undefined1  [16])0x0);
        local_b8._0_16_ = vpaddd_avx((undefined1  [16])local_d8,auVar30);
        if (local_b8._12_4_ < key) {
          auVar30._8_8_ = 0;
          auVar30._0_8_ = *(ulong *)(*(undefined1 (*) [16])((long)dataPtr + 0x10) + 8);
          auVar30 = vpmovzxbw_avx(auVar30);
          auVar31 = vpslldq_avx(auVar30,2);
          auVar32 = vpshufd_avx(local_b8._0_16_,0xff);
          auVar30 = vpaddd_avx(auVar31,auVar30);
          auVar31 = vpslldq_avx(auVar30,4);
          auVar30 = vpaddd_avx(auVar30,auVar31);
          auVar31 = vpmovzxwd_avx(auVar30);
          local_d8 = (__m128i)vpaddd_avx(auVar32,auVar31);
          auVar30 = vpunpckhwd_avx(auVar30,(undefined1  [16])0x0);
          local_b8._0_16_ = vpaddd_avx((undefined1  [16])local_d8,auVar30);
          if (local_b8._12_4_ < key) {
            dataPtr = (uint8_t *)((long)dataPtr + 0x20);
            goto LAB_00141421;
          }
          iVar13 = find_lower_bound((__m128i *)local_b8,&local_d8,key,presult);
          unaff_R13D = iVar14 + 0x18 + iVar13;
        }
        else {
          iVar13 = find_lower_bound((__m128i *)local_b8,&local_d8,key,presult);
          unaff_R13D = iVar14 + 0x10 + iVar13;
        }
      }
      else {
        auVar30 = vpbroadcastd_avx512vl();
        auVar34._8_4_ = 0x80000000;
        auVar34._0_8_ = 0x8000000080000000;
        auVar34._12_4_ = 0x80000000;
        uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar2 ^ auVar34);
        bVar19 = (byte)uVar3 & 0xf;
        bVar28 = (~bVar19 & 0xf) == 0;
        uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar29 ^ auVar34);
        bVar16 = (byte)uVar3 & 0xf;
        if (!bVar28) {
          bVar16 = bVar19;
        }
        pauVar21 = (undefined1 (*) [16])local_d8;
        if (bVar28) {
          pauVar21 = (undefined1 (*) [16])local_b8;
        }
        iVar13 = 0;
        for (uVar22 = (uint)(bVar16 ^ 0xf); (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
          iVar13 = iVar13 + 1;
        }
        auVar30 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])("" + (ulong)(bVar16 ^ 0xf) * 0x10));
        *presult = auVar30._0_4_;
        unaff_R13D = iVar13 + 8 + iVar14 + (uint)bVar28 * 4;
      }
      bVar12 = false;
    }
    else {
      auVar30 = vpbroadcastd_avx512vl();
      auVar33._8_4_ = 0x80000000;
      auVar33._0_8_ = 0x8000000080000000;
      auVar33._12_4_ = 0x80000000;
      uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar29 ^ auVar33);
      bVar19 = (byte)uVar3 & 0xf;
      bVar28 = (~bVar19 & 0xf) == 0;
      uVar3 = vpcmpgtd_avx512vl(auVar30,(undefined1  [16])alVar2 ^ auVar33);
      bVar16 = (byte)uVar3 & 0xf;
      if (!bVar28) {
        bVar16 = bVar19;
      }
      pauVar21 = (undefined1 (*) [16])local_d8;
      if (bVar28) {
        pauVar21 = (undefined1 (*) [16])local_b8;
      }
      iVar13 = 0;
      for (uVar22 = (uint)(bVar16 ^ 0xf); (uVar22 & 1) == 0; uVar22 = uVar22 >> 1 | 0x80000000) {
        iVar13 = iVar13 + 1;
      }
      auVar30 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])("" + (ulong)(bVar16 ^ 0xf) * 0x10));
      *presult = auVar30._0_4_;
      unaff_R13D = iVar14 + (uint)bVar28 * 4 + iVar13;
      bVar12 = false;
    }
  }
  else {
    auVar30 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                          *(undefined1 (*) [16])
                           (shuffleTable[0] + (uint)((int)(uVar18 & 0xff) << 4)));
    auVar31 = vpslldq_avx(auVar30,4);
    auVar30 = vpaddd_avx(auVar31,auVar30);
    auVar5._4_4_ = local_b8._12_4_;
    auVar5._0_4_ = local_b8._12_4_;
    auVar5._8_4_ = local_b8._12_4_;
    auVar5._12_4_ = local_b8._12_4_;
    auVar31 = vpaddd_avx512vl(auVar30,auVar5);
    auVar30 = vpslldq_avx(auVar30,8);
    alVar2 = (__m128i)vpaddd_avx(auVar31,auVar30);
    local_d8[0] = alVar2[0];
    local_d8[1] = alVar2[1];
    bVar16 = (byte)(uVar18 >> 8);
    pauVar21 = (undefined1 (*) [16])
               (*(undefined1 (*) [16])dataPtr +
               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [bVar16] +
               (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                      [uVar18 & 0xff]);
    auVar30 = vpshufb_avx(*(undefined1 (*) [16])
                           (*(undefined1 (*) [16])dataPtr +
                           "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar18 & 0xff]),(undefined1  [16])shuffleTable[bVar16]);
    auVar32 = vpslldq_avx(auVar30,4);
    auVar31 = vpshufd_avx((undefined1  [16])alVar2,0xff);
    auVar30 = vpaddd_avx(auVar32,auVar30);
    auVar32 = vpslldq_avx(auVar30,8);
    auVar30 = vpaddd_avx(auVar30,auVar32);
    alVar29 = (__m128i)vpaddd_avx(auVar30,auVar31);
    local_b8._0_8_ = alVar29[0];
    local_b8._8_8_ = alVar29[1];
    if (alVar29[1]._4_4_ < key) {
      uVar22 = (uint)uVar18 >> 0x10 & 0xff;
      auVar30 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])(shuffleTable[0] + (uVar22 << 4)));
      auVar32 = vpslldq_avx(auVar30,4);
      auVar31 = vpshufd_avx((undefined1  [16])alVar29,0xff);
      auVar30 = vpaddd_avx(auVar32,auVar30);
      auVar32 = vpslldq_avx(auVar30,8);
      auVar30 = vpaddd_avx(auVar30,auVar32);
      alVar2 = (__m128i)vpaddd_avx(auVar30,auVar31);
      local_d8[0] = alVar2[0];
      local_d8[1] = alVar2[1];
      uVar26 = uVar18 >> 0x18 & 0xff;
      auVar30 = vpshufb_avx(*(undefined1 (*) [16])
                             (*pauVar21 +
                             "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                             [uVar22]),
                            *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar26 << 4)));
      dataPtr = *pauVar21 +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar26] +
                (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                       [uVar22];
      auVar32 = vpslldq_avx(auVar30,4);
      auVar31 = vpshufd_avx((undefined1  [16])alVar2,0xff);
      auVar30 = vpaddd_avx(auVar32,auVar30);
      auVar32 = vpslldq_avx(auVar30,8);
      auVar30 = vpaddd_avx(auVar30,auVar32);
      alVar29 = (__m128i)vpaddd_avx(auVar30,auVar31);
      local_b8._0_8_ = alVar29[0];
      local_b8._8_8_ = alVar29[1];
      if (alVar29[1]._4_4_ < key) {
        uVar26 = uVar18 >> 0x20 & 0xff;
        auVar30 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar26 << 4)));
        auVar32 = vpslldq_avx(auVar30,4);
        auVar31 = vpshufd_avx((undefined1  [16])alVar29,0xff);
        auVar30 = vpaddd_avx(auVar32,auVar30);
        auVar32 = vpslldq_avx(auVar30,8);
        auVar30 = vpaddd_avx(auVar30,auVar32);
        alVar2 = (__m128i)vpaddd_avx(auVar30,auVar31);
        local_d8[0] = alVar2[0];
        local_d8[1] = alVar2[1];
        uVar27 = uVar18 >> 0x28 & 0xff;
        auVar30 = vpshufb_avx(*(undefined1 (*) [16])
                               (*(undefined1 (*) [16])dataPtr +
                               "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                               [uVar26]),
                              *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar27 << 4)));
        dataPtr = *(undefined1 (*) [16])dataPtr +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar27] +
                  (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                         [uVar26];
        auVar32 = vpslldq_avx(auVar30,4);
        auVar31 = vpshufd_avx((undefined1  [16])alVar2,0xff);
        auVar30 = vpaddd_avx(auVar32,auVar30);
        auVar32 = vpslldq_avx(auVar30,8);
        auVar30 = vpaddd_avx(auVar30,auVar32);
        alVar29 = (__m128i)vpaddd_avx(auVar30,auVar31);
        local_b8._0_8_ = alVar29[0];
        local_b8._8_8_ = alVar29[1];
        if (alVar29[1]._4_4_ < key) {
          uVar26 = uVar18 >> 0x30 & 0xff;
          auVar30 = vpshufb_avx(*(undefined1 (*) [16])dataPtr,
                                *(undefined1 (*) [16])(shuffleTable[0] + (uint)((int)uVar26 << 4)));
          auVar32 = vpslldq_avx(auVar30,4);
          auVar31 = vpshufd_avx((undefined1  [16])alVar29,0xff);
          auVar30 = vpaddd_avx(auVar32,auVar30);
          auVar32 = vpslldq_avx(auVar30,8);
          auVar30 = vpaddd_avx(auVar30,auVar32);
          local_d8 = (__m128i)vpaddd_avx(auVar30,auVar31);
          auVar30 = vpshufb_avx(*(undefined1 (*) [16])
                                 (*(undefined1 (*) [16])dataPtr +
                                 "\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                                 [uVar26]),(undefined1  [16])shuffleTable[uVar18 >> 0x38]);
          dataPtr = *(undefined1 (*) [16])dataPtr +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar18 >> 0x38] +
                    (ulong)"\x04\x05\x06\a\x05\x06\a\b\x06\a\b\t\a\b\t\n\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\x05\x06\a\b\x06\a\b\t\a\b\t\n\b\t\n\v\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\x06\a\b\t\a\b\t\n\b\t\n\v\t\n\v\f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\a\b\t\n\b\t\n\v\t\n\v\f\n\v\f\r\b\t\n\v\t\n\v\f\n\v\f\r\v\f\r\x0e\t\n\v\f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\n\v\f\r\v\f\r\x0e\f\r\x0e\x0f\r\x0e\x0f\x10"
                           [uVar26];
          auVar32 = vpslldq_avx(auVar30,4);
          auVar31 = vpshufd_avx((undefined1  [16])local_d8,0xff);
          auVar30 = vpaddd_avx(auVar32,auVar30);
          auVar32 = vpslldq_avx(auVar30,8);
          auVar30 = vpaddd_avx(auVar30,auVar32);
          local_b8._0_16_ = vpaddd_avx(auVar30,auVar31);
          if (local_b8._12_4_ < key) {
LAB_00141421:
            iVar14 = iVar14 + 0x20;
            bVar12 = true;
            prev = local_b8._12_4_;
          }
          else {
            iVar13 = find_lower_bound((__m128i *)local_b8,&local_d8,key,presult);
            unaff_R13D = iVar14 + 0x18 + iVar13;
            bVar12 = false;
          }
          goto LAB_00141790;
        }
        auVar30 = vpbroadcastd_avx512vl();
        auVar6._8_4_ = 0x80000000;
        auVar6._0_8_ = 0x8000000080000000;
        auVar6._12_4_ = 0x80000000;
        auVar31 = vpxord_avx512vl((undefined1  [16])alVar2,auVar6);
        uVar18 = vpcmpgtd_avx512vl(auVar30,auVar31);
        if ((~(byte)(uVar18 & 0xf) & 0xf) == 0) {
          pauVar21 = (undefined1 (*) [16])local_b8;
          auVar7._8_4_ = 0x80000000;
          auVar7._0_8_ = 0x8000000080000000;
          auVar7._12_4_ = 0x80000000;
          auVar31 = vpxord_avx512vl((undefined1  [16])alVar29,auVar7);
          uVar3 = vpcmpgtd_avx512vl(auVar30,auVar31);
          uVar22 = (uint)uVar3 & 0xf;
          iVar13 = 4;
        }
        else {
          uVar22 = (uint)(uVar18 & 0xf);
          iVar13 = 0;
          pauVar21 = (undefined1 (*) [16])local_d8;
        }
        iVar4 = 0;
        for (uVar17 = uVar22 ^ 0xf; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
          iVar4 = iVar4 + 1;
        }
        auVar30 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])("" + ((uVar22 ^ 0xf) << 4)));
        *presult = auVar30._0_4_;
        unaff_R13D = iVar13 + 0x10 + iVar4 + iVar14;
      }
      else {
        auVar30 = vpbroadcastd_avx512vl();
        auVar8._8_4_ = 0x80000000;
        auVar8._0_8_ = 0x8000000080000000;
        auVar8._12_4_ = 0x80000000;
        auVar31 = vpxord_avx512vl((undefined1  [16])alVar2,auVar8);
        uVar18 = vpcmpgtd_avx512vl(auVar30,auVar31);
        if ((~(byte)(uVar18 & 0xf) & 0xf) == 0) {
          pauVar21 = (undefined1 (*) [16])local_b8;
          auVar9._8_4_ = 0x80000000;
          auVar9._0_8_ = 0x8000000080000000;
          auVar9._12_4_ = 0x80000000;
          auVar31 = vpxord_avx512vl((undefined1  [16])alVar29,auVar9);
          uVar3 = vpcmpgtd_avx512vl(auVar30,auVar31);
          uVar22 = (uint)uVar3 & 0xf;
          iVar13 = 4;
        }
        else {
          uVar22 = (uint)(uVar18 & 0xf);
          iVar13 = 0;
          pauVar21 = (undefined1 (*) [16])local_d8;
        }
        iVar4 = 0;
        for (uVar17 = uVar22 ^ 0xf; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
          iVar4 = iVar4 + 1;
        }
        auVar30 = vpshufb_avx(*pauVar21,*(undefined1 (*) [16])("" + ((uVar22 ^ 0xf) << 4)));
        *presult = auVar30._0_4_;
        unaff_R13D = iVar13 + 8 + iVar4 + iVar14;
      }
    }
    else {
      auVar30 = vpbroadcastd_avx512vl();
      auVar10._8_4_ = 0x80000000;
      auVar10._0_8_ = 0x8000000080000000;
      auVar10._12_4_ = 0x80000000;
      auVar31 = vpxord_avx512vl((undefined1  [16])alVar2,auVar10);
      uVar18 = vpcmpgtd_avx512vl(auVar30,auVar31);
      if ((~(byte)(uVar18 & 0xf) & 0xf) == 0) {
        pauVar15 = (undefined1 (*) [16])local_b8;
        auVar11._8_4_ = 0x80000000;
        auVar11._0_8_ = 0x8000000080000000;
        auVar11._12_4_ = 0x80000000;
        auVar31 = vpxord_avx512vl((undefined1  [16])alVar29,auVar11);
        uVar3 = vpcmpgtd_avx512vl(auVar30,auVar31);
        uVar22 = (uint)uVar3 & 0xf;
        iVar13 = 4;
      }
      else {
        uVar22 = (uint)(uVar18 & 0xf);
        iVar13 = 0;
        pauVar15 = (undefined1 (*) [16])local_d8;
      }
      iVar4 = 0;
      for (uVar17 = uVar22 ^ 0xf; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x80000000) {
        iVar4 = iVar4 + 1;
      }
      auVar30 = vpshufb_avx(*pauVar15,*(undefined1 (*) [16])("" + ((uVar22 ^ 0xf) << 4)));
      *presult = auVar30._0_4_;
      unaff_R13D = iVar13 + iVar14 + iVar4;
      dataPtr = (uint8_t *)pauVar21;
    }
    bVar12 = false;
  }
LAB_00141790:
  if (!bVar12) {
    return unaff_R13D;
  }
LAB_0014179b:
  uVar22 = (uint)count & 0x1f;
  if ((count & 0x1f) != 0) {
    svb_decode_scalar_d1_init
              ((uint32_t *)local_b8,keyPtr + (count >> 2 & 0xfffffffffffffff8),dataPtr,uVar22,prev);
    uVar17 = uVar22 - 1;
    uVar18 = (ulong)uVar17;
    uVar1 = *(uint *)(local_b8 + uVar18 * 4);
    if (key <= uVar1) {
      uVar20 = 0;
      if (2 < uVar22) {
        uVar20 = 0;
        do {
          uVar17 = (uint)uVar18;
          uVar23 = (int)(uVar17 - uVar20) / 2 + uVar20;
          uVar22 = uVar23;
          if (key <= *(uint *)(local_b8 + (long)(int)uVar23 * 4)) {
            uVar18 = (ulong)uVar23;
            uVar22 = uVar20;
            uVar17 = uVar23;
          }
          uVar20 = uVar22;
        } while ((int)(uVar20 + 1) < (int)uVar17);
      }
      if (*(uint *)(local_b8 + (long)(int)uVar20 * 4) < key) {
        uVar20 = uVar17;
      }
      *local_c8 = *(uint32_t *)(local_b8 + (long)(int)uVar20 * 4);
      unaff_R13D = uVar20 + iVar14;
    }
    if (key <= uVar1) {
      return unaff_R13D;
    }
  }
  *local_c8 = key + 1;
  return (uint)count;
}

Assistant:

int svb_find_avx_d1_init(uint8_t *keyPtr, uint8_t *dataPtr, uint64_t count,
                         uint32_t prev, uint32_t key, uint32_t *presult) {
  uint64_t keybytes = count / 4; // number of key bytes
  int consumedInts = 0;

  if (keybytes >= 8) {
    xmm_t PrevHi = _mm_set1_epi32(prev);
    xmm_t PrevLow;
    xmm_t Data;

    int64_t Offset = -(int64_t)keybytes / 8 + 1;

    const uint64_t *keyPtr64 = (const uint64_t *)keyPtr - Offset;
    uint64_t nextkeys = keyPtr64[Offset];
    for (; Offset != 0; ++Offset) {
      uint64_t keys = nextkeys;
      nextkeys = keyPtr64[Offset + 1];
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row

        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }
        dataPtr += 32;
        consumedInts += 32;
        continue;
      }

      Data = _decode_avx(keys & 0x00FF, &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 8 + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 16 + s);
      }

      keys >>= 16;
      Data = _decode_avx((keys & 0x00FF), &dataPtr);
      PrevLow = _scan_avx_d1(Data, PrevHi);
      Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
      PrevHi = _scan_avx_d1(Data, PrevLow);
      // check 8 ints
      if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
        int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
        return (consumedInts + 24 + s);
      }

      consumedInts += 32;
    }
    {
      uint64_t keys = nextkeys;
      // faster 16-bit delta since we only have 8-bit values
      if (!keys) { // 32 1-byte ints in a row
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 8)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_lddqu_si128((xmm_t *)(dataPtr + 16)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }
        Data = _mm_cvtepu8_epi16(_mm_loadl_epi64((xmm_t *)(dataPtr + 24)));
        _scan_16bit_avx_d1(Data, &PrevHi, &PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }

        dataPtr += 32;
        consumedInts += 32;

      } else {

        Data = _decode_avx(keys & 0x00FF, &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 8 + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 16 + s);
        }

        keys >>= 16;
        Data = _decode_avx((keys & 0x00FF), &dataPtr);
        PrevLow = _scan_avx_d1(Data, PrevHi);
        Data = _decode_avx((keys & 0xFF00) >> 8, &dataPtr);
        PrevHi = _scan_avx_d1(Data, PrevLow);
        // check 8 ints
        if (key <= (uint32_t)_mm_extract_epi32(PrevHi, 3)) {
          int s = find_lower_bound(&PrevHi, &PrevLow, key, presult);
          return (consumedInts + 24 + s);
        }

        consumedInts += 32;
      }
      // extract the highest integer which was stored so far;
      // it will be the "prev" value for the remaining data
      prev = (uint32_t)_mm_extract_epi32(PrevHi, 3);
    }
  }
  uint32_t keysleft = count & 31;
  if (keysleft > 0) {
    uint64_t consumedkeys = keybytes - (keybytes & 7);
    uint32_t out[32];
    svb_decode_scalar_d1_init(out, keyPtr + consumedkeys, dataPtr, keysleft,
                              prev);
    if (key <= out[keysleft - 1]) {
      int s = lower_bound(out, key, 0, keysleft);
      assert(s >= 0 && s < (int)keysleft);
      *presult = out[s];
      return (consumedInts + s);
    }
  }

  // key was not found!
  *presult = key + 1;
  return (int)count;
}